

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

uint __thiscall
llvm::detail::DoubleAPFloat::convertToHexString
          (DoubleAPFloat *this,char *DST,uint HexDigits,bool UpperCase,roundingMode RM)

{
  uint uVar1;
  DoubleAPFloat local_60;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat
              (&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_60);
    uVar1 = APFloat::convertToHexString(&local_50,DST,HexDigits,UpperCase,RM);
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    APInt::~APInt((APInt *)&local_60);
    return uVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10f8,
                "unsigned int llvm::detail::DoubleAPFloat::convertToHexString(char *, unsigned int, bool, roundingMode) const"
               );
}

Assistant:

unsigned int DoubleAPFloat::convertToHexString(char *DST,
                                               unsigned int HexDigits,
                                               bool UpperCase,
                                               roundingMode RM) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .convertToHexString(DST, HexDigits, UpperCase, RM);
}